

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O3

void nh_describe_pos(int x,int y,nh_desc_buf *bufs)

{
  monst *pmVar1;
  bool bVar2;
  bool bVar3;
  boolean bVar4;
  aligntyp alignment;
  uint uVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  trap *ptVar9;
  obj *poVar10;
  obj *poVar11;
  char *pcVar12;
  size_t sVar13;
  int iVar14;
  uint uVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  level *lev;
  char *pcVar19;
  char *pcVar20;
  byte bVar21;
  uint uVar22;
  bool bVar23;
  bool bVar24;
  char visionbuf [256];
  char race [128];
  char steedbuf [256];
  char local_338 [6];
  undefined8 uStack_332;
  undefined2 auStack_328 [120];
  char local_238 [256];
  char local_138 [264];
  
  uVar5 = dbuf_get_mon(x,y);
  bufs->bgdesc[0] = '\0';
  bufs->trapdesc[0] = '\0';
  bufs->objdesc[0] = '\0';
  bufs->mondesc[0] = '\0';
  bufs->invisdesc[0] = '\0';
  bufs->effectdesc[0] = '\0';
  bufs->objcount = -1;
  if (program_state.game_running == 0) {
    return;
  }
  iVar14 = exit_jmp_buf_valid + 1;
  bVar23 = exit_jmp_buf_valid == 0;
  exit_jmp_buf_valid = iVar14;
  if ((bVar23) && (iVar14 = __sigsetjmp(exit_jmp_buf,1), iVar14 != 0)) {
    return;
  }
  uVar15 = *(uint *)(level->locations[x] + y) & 0x3f;
  if (uVar15 < 0x18) {
    if (uVar15 != 0) {
      if (uVar15 == 0x13) {
        bVar4 = on_level(&u.uz,&dungeon_topology.d_air_level);
        pcVar17 = "cloudy area";
        if (bVar4 == '\0') {
          pcVar17 = "fog/vapor cloud";
        }
      }
      else {
LAB_0020d391:
        pcVar17 = defexplain[uVar15];
      }
      strcpy(bufs->bgdesc,pcVar17);
    }
  }
  else if (uVar15 == 0x18) {
    iVar14 = is_drawbridge_wall(x,y);
    if (iVar14 < 0) {
      if ((*(uint *)&level->locations[x][y].field_0x6 & 0xf0) != 0x10) {
        uVar8 = 0x796177726f6f64;
        goto LAB_0020d420;
      }
      builtin_strncpy(bufs->bgdesc,"broken door",0xc);
    }
    else {
      builtin_strncpy(bufs->bgdesc,"open drawbridge portcullis",0x1b);
    }
  }
  else {
    if (uVar15 != 0x26) goto LAB_0020d391;
    if (u.uz.dnum == dungeon_topology.d_astral_level.dnum) {
      builtin_strncpy(bufs->bgdesc + 6,"d altar",8);
      uVar8 = 0x2064656e67696c61;
LAB_0020d420:
      *(undefined8 *)bufs->bgdesc = uVar8;
    }
    else {
      uVar15 = *(uint *)&level->locations[x][y].field_0x6 >> 4 & 0x17;
      if (uVar15 == 0) {
        alignment = -0x80;
      }
      else if (uVar15 == 4) {
        alignment = '\x01';
      }
      else {
        alignment = (char)uVar15 + -2;
      }
      pcVar17 = align_str(alignment);
      sprintf(bufs->bgdesc,"%s altar",pcVar17,0);
    }
  }
  if (((undefined1  [12])((undefined1  [12])level->locations[x][y] & (undefined1  [12])0x7c0) !=
       (undefined1  [12])0x0) &&
     ((((0x193 < (int)uVar5 || uVar5 == 0 ||
        ((((u.ux == x && (u.uy == y)) || (pmVar1 = level->monsters[x][y], pmVar1 == (monst *)0x0))
         || (((*(uint *)&pmVar1->field_0x60 & 0x800200) != 0x800000 || ((viz_array[y][x] & 2U) == 0)
             ))))) || (ptVar9 = t_at(level,x,y), ptVar9 == (trap *)0x0)) ||
      ((uVar15 = (byte)ptVar9->field_0x8 & 0x1f, 0x13 < uVar15 || ((0x81820U >> uVar15 & 1) == 0))))
     )) {
    strcpy(bufs->trapdesc,
           *(char **)((long)defexplain +
                     (ulong)(*(uint *)(level->locations[x] + y) >> 3 & 0xf8) + 0x178));
  }
  lev = level;
  uVar22 = *(uint *)(level->locations[x] + y) >> 0xb & 0x3ff;
  uVar15 = 0xffffffff;
  iVar14 = uVar22 - 1;
  if (uVar22 != 0) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0020d58b;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0020d586;
LAB_0020d625:
      bVar24 = true;
      bVar23 = false;
    }
    else {
LAB_0020d586:
      if (ublindf == (obj *)0x0) {
        if (uball == (obj *)0x0) goto LAB_0020d625;
      }
      else {
LAB_0020d58b:
        if (ublindf->oartifact == '\x1d' || uball == (obj *)0x0) goto LAB_0020d625;
      }
      bVar24 = true;
      if ((((u.bc_felt & 1U) == 0) && (uball->where != '\x03')) && (uball->ox == x)) {
        bVar24 = uball->oy != y;
      }
      if (((u.bc_felt & 2U) == 0) && (uchain->ox == x)) {
        bVar23 = uchain->oy == y;
      }
      else {
        bVar23 = false;
      }
    }
    pcVar17 = bufs->objdesc;
    poVar11 = level->objects[x][y];
    if (poVar11 == (obj *)0x0) {
      poVar10 = (obj *)0x0;
    }
    else {
      poVar10 = (obj *)0x0;
      do {
        if ((((bVar24 ^ 1U) & poVar11 == uball) == 0) && (!(bool)(poVar11 == uchain & bVar23))) {
          poVar10 = poVar11;
          if (iVar14 == poVar11->otyp) {
            pcVar12 = distant_name(poVar11,xname);
            strcpy(pcVar17,pcVar12);
            lev = level;
            goto LAB_0020d78d;
          }
          break;
        }
        poVar11 = (poVar11->v).v_nexthere;
      } while (poVar11 != (obj *)0x0);
    }
    if (iVar14 == 0) {
      builtin_strncpy(pcVar17,"strange object",0xf);
      poVar11 = poVar10;
    }
    else {
      poVar11 = mksobj(level,iVar14,'\0','\0');
      if (poVar11->oclass == '\f') {
        poVar11->quan = 1;
      }
      else if (poVar11->otyp == 0x11e) {
        poVar11->spe = (schar)current_fruit;
      }
      if (*(int *)(level->locations[x] + y) < 0) {
        poVar11->field_0x4b = poVar11->field_0x4b | 0x20;
      }
      pcVar12 = distant_name(poVar11,xname);
      strcpy(pcVar17,pcVar12);
      dealloc_obj(poVar11);
      poVar11 = level->objects[x][y];
      lev = level;
    }
LAB_0020d78d:
    if ((lev->locations[x][y].field_0x3 & 0x40) != 0) {
      sVar13 = strlen(pcVar17);
      builtin_strncpy(pcVar17 + sVar13," and more",10);
      lev = level;
    }
    bVar21 = lev->locations[x][y].typ;
    if ((bVar21 & 0xef) == 0) {
      sVar13 = strlen(pcVar17);
      builtin_strncpy(pcVar17 + sVar13," embedded in stone",0x13);
    }
    else if ((char)bVar21 < '\r' || bVar21 == 0xf) {
      sVar13 = strlen(pcVar17);
      builtin_strncpy(pcVar17 + sVar13," embedded in a wall",0x14);
    }
    else {
      bVar4 = closed_door(lev,x,y);
      if (bVar4 == '\0') {
        bVar4 = is_pool(level,x,y);
        if (bVar4 == '\0') {
          bVar4 = is_lava(level,x,y);
          if (bVar4 != '\0') {
            sVar13 = strlen(pcVar17);
            builtin_strncpy(pcVar17 + sVar13," in molten lava",0x10);
          }
        }
        else {
          sVar13 = strlen(pcVar17);
          builtin_strncpy(pcVar17 + sVar13," in water",10);
        }
      }
      else {
        sVar13 = strlen(pcVar17);
        builtin_strncpy(pcVar17 + sVar13," embedded in a door",0x14);
      }
    }
    uVar15 = 0xffffffff;
    if ((viz_array[y][x] & 2U) != 0) {
      if (poVar11 == (obj *)0x0) {
        uVar15 = 1;
      }
      else {
        uVar15 = (uint)(iVar14 != poVar11->otyp);
        do {
          uVar15 = uVar15 + (byte)((poVar11 != uchain | bVar23 ^ 1U) & (poVar11 != uball | bVar24));
          poVar11 = (poVar11->v).v_nexthere;
        } while (poVar11 != (obj *)0x0);
      }
    }
  }
  bufs->objcount = uVar15;
  bVar23 = true;
  if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
    if (u.umonnum == u.umonster) {
      bVar23 = false;
    }
    else {
      bVar4 = dmgtype(youmonst.data,0x24);
      bVar23 = bVar4 != '\0';
    }
  }
  if (uVar5 != 0) {
    pcVar17 = bufs->mondesc;
    if ((u.ux == x) && (u.uy == y)) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0020d96c;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0020d963;
LAB_0020d995:
        if ((u._1052_1_ & 1) == 0) {
          if (((((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
                 (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
               (u.uprops[0xd].blocked == 0)) && (u.uprops[0xc].intrinsic == 0)) &&
             (u.uprops[0xc].extrinsic == 0)) {
            if (((u._1052_1_ & 4) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
LAB_0020da53:
              if ((u.uprops[0x19].extrinsic == 0 || u.uprops[0x19].blocked != 0) &&
                 ((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0))))
              goto LAB_0020da7d;
            }
          }
          else if ((u._1052_1_ & 4) != 0) goto LAB_0020da53;
        }
      }
      else {
LAB_0020d963:
        if (ublindf != (obj *)0x0) {
LAB_0020d96c:
          if (ublindf->oartifact == '\x1d') goto LAB_0020d995;
        }
      }
      local_238[0] = '\0';
      if (u.umonnum == u.umonster) {
        sprintf(local_238,"%s ",urace.adj);
      }
      pcVar12 = "invisible ";
      if (u.uprops[0xd].blocked != 0) {
        pcVar12 = "";
      }
      pcVar16 = "";
      if (youmonst.data == mons + 0x7b) {
        pcVar16 = pcVar12;
      }
      if (youmonst.data == mons + 0x9e) {
        pcVar16 = pcVar12;
      }
      if (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0) {
        pcVar16 = pcVar12;
      }
      pcVar12 = mons_mname(mons + u.umonnum);
      sprintf(pcVar17,"%s%s%s called %s",pcVar16,local_238,pcVar12,plname);
      if (u.usteed != (monst *)0x0) {
        pcVar12 = y_monnam(u.usteed);
        sprintf(local_138,", mounted on %s",pcVar12);
        strcat(pcVar17,local_138);
      }
      if ((((((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
              (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
            (u.uprops[0xd].blocked == 0)) && (u.uprops[0xc].intrinsic == 0)) &&
          ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0)))) ||
         ((u._1052_1_ & 4) != 0)) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0020dc45;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0020dc3c;
LAB_0020dcee:
          if ((u._1052_1_ & 1) == 0) {
            if ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
               (uVar5 = 0, ((youmonst.data)->mflags3 & 0x100) != 0)) {
              uVar5 = 1;
            }
            uVar15 = uVar5 + 2;
            if (u.uprops[0x19].blocked != 0) {
              uVar15 = uVar5;
            }
            if (u.uprops[0x19].extrinsic == 0) {
              uVar15 = uVar5;
            }
            uVar5 = uVar15 + 4;
            if (u.uprops[0x42].extrinsic == 0 && u.uprops[0x42].intrinsic == 0) {
              uVar5 = uVar15;
            }
            if (uVar5 != 0) {
              pcVar17 = eos(pcVar17);
              pcVar12 = "infravision";
              if ((uVar5 & 1) == 0) {
                pcVar12 = "";
              }
              pcVar20 = ", ";
              pcVar16 = "";
              if ((~uVar5 & 3) == 0) {
                pcVar16 = ", ";
              }
              pcVar19 = "telepathy";
              if ((uVar5 & 2) == 0) {
                pcVar19 = "";
              }
              if (uVar5 < 5) {
                pcVar20 = "";
              }
              pcVar18 = "monster detection";
              if (uVar5 < 4) {
                pcVar18 = "";
              }
              sprintf(pcVar17," [seen: %s%s%s%s%s]",pcVar12,pcVar16,pcVar19,pcVar20,pcVar18);
            }
          }
        }
        else {
LAB_0020dc3c:
          if (ublindf != (obj *)0x0) {
LAB_0020dc45:
            if (ublindf->oartifact == '\x1d') goto LAB_0020dcee;
          }
        }
      }
    }
    else {
LAB_0020da7d:
      if ((int)uVar5 < 0x194) {
        pmVar1 = level->monsters[x][y];
        if ((pmVar1 != (monst *)0x0) && ((pmVar1->field_0x61 & 2) == 0)) {
          bhitpos.x = (xchar)x;
          bhitpos.y = (xchar)y;
          if ((bool)(pmVar1->data == mons + 0x10 & bVar23)) {
            pcVar12 = coyotename(pmVar1,local_238);
          }
          else {
            pcVar12 = distant_monnam(pmVar1,0,local_238);
          }
          if ((pmVar1->mx == x) && (pmVar1->my == y)) {
            pcVar16 = "";
          }
          else {
            pcVar16 = "tail of ";
            if (!bVar23) {
              pcVar16 = "tail of a ";
            }
            if ((pmVar1->field_0x63 & 2) == 0) {
              pcVar16 = "tail of a ";
            }
          }
          if ((bool)(pmVar1->mtame != '\0' & bVar23)) {
            pcVar20 = "tame ";
          }
          else {
            pcVar20 = "peaceful ";
            if (!bVar23) {
              pcVar20 = "";
            }
            if ((pmVar1->field_0x62 & 0x40) == 0) {
              pcVar20 = "";
            }
          }
          sprintf(pcVar17,"%s%s%s",pcVar16,pcVar20,pcVar12);
          if (u.ustuck == pmVar1) {
            if (u.umonnum == u.umonster) {
              pcVar12 = ", holding you";
            }
            else {
              bVar4 = sticks(youmonst.data);
              pcVar12 = ", being held";
              if (bVar4 == '\0') {
                pcVar12 = ", holding you";
              }
            }
            strcat(pcVar17,pcVar12);
          }
          uVar5 = *(uint *)&pmVar1->field_0x60;
          if ((uVar5 >> 0x18 & 1) != 0) {
            sVar13 = strlen(pcVar17);
            builtin_strncpy(pcVar17 + sVar13,", leashed to you",0x11);
            uVar5 = *(uint *)&pmVar1->field_0x60;
          }
          if ((uVar5 >> 0x17 & 1) != 0) {
            if (((((viz_array[pmVar1->my][pmVar1->mx] & 2U) != 0) &&
                 (ptVar9 = t_at(level,(int)pmVar1->mx,(int)pmVar1->my), ptVar9 != (trap *)0x0)) &&
                (uVar5 = (byte)ptVar9->field_0x8 & 0x1f, (byte)uVar5 < 0x14)) &&
               ((0x81820U >> uVar5 & 1) != 0)) {
              pcVar12 = eos(pcVar17);
              pcVar16 = an(trapexplain[uVar5 - 1]);
              sprintf(pcVar12,", trapped in %s",pcVar16);
            }
          }
          if (pmVar1->wormno == '\0') {
            if ((viz_array[pmVar1->my][pmVar1->mx] & 2U) != 0) goto LAB_0020e0a5;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0020e046;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0020e03d;
            }
            else {
LAB_0020e03d:
              if (ublindf == (obj *)0x0) goto LAB_0020e0f6;
LAB_0020e046:
              if (ublindf->oartifact != '\x1d') goto LAB_0020e0f6;
            }
            if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
               (((youmonst.data)->mflags3 & 0x100) == 0)) goto LAB_0020e0f6;
            bVar23 = false;
            if (((viz_array[pmVar1->my][pmVar1->mx] & 1U) != 0) &&
               ((pmVar1->data->mflags3 & 0x200) != 0)) goto LAB_0020e0a5;
          }
          else {
            bVar4 = worm_known(level,pmVar1);
            if (bVar4 == '\0') {
LAB_0020e0f6:
              bVar23 = false;
            }
            else {
LAB_0020e0a5:
              uVar5 = *(uint *)&pmVar1->field_0x60;
              if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((char)uVar5 < '\0') goto LAB_0020e0f6;
              }
              else {
                bVar23 = false;
                if (((char)uVar5 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0))
                goto LAB_0020e0fa;
              }
              bVar23 = (u._1052_1_ & 0x20) == 0 && (uVar5 >> 9 & 1) == 0;
            }
          }
LAB_0020e0fa:
          local_338[0] = '\0';
          iVar14 = -1;
          if (-1 < u.xray_range) {
            iVar14 = u.xray_range * u.xray_range;
          }
          if (pmVar1->wormno == '\0') {
            uVar5 = 0;
            bVar24 = false;
            if ((viz_array[pmVar1->my][pmVar1->mx] & 2U) != 0) goto LAB_0020e164;
          }
          else {
            bVar4 = worm_known(level,pmVar1);
            if (bVar4 == '\0') {
              uVar5 = 0;
              bVar24 = false;
            }
            else {
LAB_0020e164:
              uVar15 = *(uint *)&pmVar1->field_0x60;
              if ((((uVar15 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                uVar5 = 0;
                bVar24 = false;
                if ((uVar15 & 0x280) == 0) goto LAB_0020e1ac;
              }
              else {
                uVar5 = 0;
                bVar24 = false;
                if (((uVar15 & 0x280) == 0) &&
                   (bVar24 = false, ((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0020e1ac:
                  bVar24 = (u._1052_1_ & 0x20) == 0 && (uVar15 & 2) == 0;
                  uVar5 = (uint)bVar24;
                }
              }
            }
          }
          iVar6 = ((uint)bVar23 & *(uint *)&pmVar1->field_0x60 >> 1) + uVar5;
          if (((((*(uint *)&pmVar1->field_0x60 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
              (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0020e21f;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0020e216;
LAB_0020e258:
              if (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                  (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                 ((pmVar1->data->mflags3 & 0x200) != 0)) {
                iVar6 = iVar6 + ((byte)viz_array[pmVar1->my][pmVar1->mx] & 1);
              }
            }
            else {
LAB_0020e216:
              if (ublindf != (obj *)0x0) {
LAB_0020e21f:
                if (ublindf->oartifact == '\x1d') goto LAB_0020e258;
              }
            }
          }
          if (((pmVar1->data->mflags1 & 0x10000) == 0) &&
             ((poVar11 = which_armor(pmVar1,4), poVar11 == (obj *)0x0 ||
              (poVar11 = which_armor(pmVar1,4), poVar11->otyp != 0x4f)))) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0020e2fd;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0020e2f8;
LAB_0020e389:
              if ((u.uprops[0x19].extrinsic == 0) ||
                 ((u.uprops[0x19].blocked != 0 ||
                  (iVar7 = dist2((int)pmVar1->mx,(int)pmVar1->my,(int)u.ux,(int)u.uy), 0x40 < iVar7)
                  ))) goto LAB_0020e3bc;
            }
            else {
LAB_0020e2f8:
              if (ublindf != (obj *)0x0) {
LAB_0020e2fd:
                if (ublindf->oartifact == '\x1d') goto LAB_0020e389;
              }
              if ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                   (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                   youmonst.data != mons + 0x32) || (u.uprops[0x19].blocked != 0))
              goto LAB_0020e389;
            }
            iVar6 = iVar6 + 1;
          }
LAB_0020e3bc:
          bVar21 = 0 < iVar14 & bVar23;
          if (bVar21 == 1) {
            iVar7 = dist2((int)pmVar1->mx,(int)pmVar1->my,(int)u.ux,(int)u.uy);
            iVar6 = iVar6 + (uint)(iVar7 <= iVar14);
          }
          bVar2 = u.uprops[0x42].extrinsic != 0;
          bVar3 = u.uprops[0x42].intrinsic != 0;
          bVar4 = match_warn_of_mon(pmVar1);
          uVar5 = ((uint)(bVar2 || bVar3) + iVar6 + 1) - (uint)(bVar4 == '\0');
          if (!(bool)(bVar24 & uVar5 < 2)) {
            uVar15 = uVar5;
            if (bVar24) {
              sVar13 = strlen(local_338);
              builtin_strncpy(local_338 + sVar13,"normal v",8);
              *(undefined8 *)((long)&uStack_332 + sVar13) = 0x6e6f6973697620;
              uVar15 = uVar5 - 1;
              if (1 < uVar5) {
                sVar13 = strlen(local_338);
                (local_338 + sVar13)[0] = ',';
                (local_338 + sVar13)[1] = ' ';
                local_338[sVar13 + 2] = '\0';
              }
            }
            uVar5 = uVar15;
            if ((bVar23 != false) && ((pmVar1->field_0x60 & 2) != 0)) {
              sVar13 = strlen(local_338);
              builtin_strncpy(local_338 + sVar13,"see invi",8);
              *(undefined8 *)((long)&uStack_332 + sVar13) = 0x656c6269736976;
              uVar5 = uVar15 - 1;
              if (1 < (int)uVar15) {
                sVar13 = strlen(local_338);
                (local_338 + sVar13)[0] = ',';
                (local_338 + sVar13)[1] = ' ';
                local_338[sVar13 + 2] = '\0';
              }
            }
            if (((((pmVar1->field_0x60 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0020e53e;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0020e539;
LAB_0020e564:
                if (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                    (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                   (((pmVar1->data->mflags3 & 0x200) != 0 &&
                    ((viz_array[pmVar1->my][pmVar1->mx] & 1U) != 0)))) {
                  sVar13 = strlen(local_338);
                  builtin_strncpy(local_338 + sVar13,"infravis",8);
                  *(undefined4 *)((long)&uStack_332 + sVar13 + 2) = 0x6e6f69;
                  uVar15 = uVar5 - 1;
                  bVar23 = 1 < (int)uVar5;
                  uVar5 = uVar15;
                  if (bVar23) {
                    sVar13 = strlen(local_338);
                    (local_338 + sVar13)[0] = ',';
                    (local_338 + sVar13)[1] = ' ';
                    local_338[sVar13 + 2] = '\0';
                  }
                }
              }
              else {
LAB_0020e539:
                if (ublindf != (obj *)0x0) {
LAB_0020e53e:
                  if (ublindf->oartifact == '\x1d') goto LAB_0020e564;
                }
              }
            }
            if (((pmVar1->data->mflags1 & 0x10000) == 0) &&
               ((poVar11 = which_armor(pmVar1,4), poVar11 == (obj *)0x0 ||
                (poVar11 = which_armor(pmVar1,4), poVar11->otyp != 0x4f)))) {
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0020e606;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0020e601;
LAB_0020e692:
                if ((u.uprops[0x19].extrinsic == 0) ||
                   ((u.uprops[0x19].blocked != 0 ||
                    (iVar6 = dist2((int)pmVar1->mx,(int)pmVar1->my,(int)u.ux,(int)u.uy),
                    0x40 < iVar6)))) goto LAB_0020e709;
              }
              else {
LAB_0020e601:
                if (ublindf != (obj *)0x0) {
LAB_0020e606:
                  if (ublindf->oartifact == '\x1d') goto LAB_0020e692;
                }
                if ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                     (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                     youmonst.data != mons + 0x32) || (u.uprops[0x19].blocked != 0))
                goto LAB_0020e692;
              }
              sVar13 = strlen(local_338);
              builtin_strncpy(local_338 + sVar13,"telepath",8);
              *(undefined2 *)((long)&uStack_332 + sVar13 + 2) = 0x79;
              uVar15 = uVar5 - 1;
              bVar23 = 1 < (int)uVar5;
              uVar5 = uVar15;
              if (bVar23) {
                sVar13 = strlen(local_338);
                (local_338 + sVar13)[0] = ',';
                (local_338 + sVar13)[1] = ' ';
                local_338[sVar13 + 2] = '\0';
              }
            }
LAB_0020e709:
            uVar15 = uVar5;
            if ((bVar21 != 0) &&
               (iVar6 = dist2((int)pmVar1->mx,(int)pmVar1->my,(int)u.ux,(int)u.uy), iVar6 <= iVar14)
               ) {
              sVar13 = strlen(local_338);
              builtin_strncpy(local_338 + sVar13,"astral v",8);
              *(undefined8 *)((long)&uStack_332 + sVar13) = 0x6e6f6973697620;
              uVar15 = uVar5 - 1;
              if (1 < (int)uVar5) {
                sVar13 = strlen(local_338);
                (local_338 + sVar13)[0] = ',';
                (local_338 + sVar13)[1] = ' ';
                local_338[sVar13 + 2] = '\0';
              }
            }
            uVar5 = uVar15;
            if (u.uprops[0x42].extrinsic != 0 || u.uprops[0x42].intrinsic != 0) {
              sVar13 = strlen(local_338);
              builtin_strncpy(local_338 + sVar13,"monster ",8);
              builtin_strncpy((char *)((long)&uStack_332 + sVar13 + 2),"detectio",8);
              *(undefined2 *)((long)auStack_328 + sVar13) = 0x6e;
              uVar5 = uVar15 - 1;
              if (1 < (int)uVar15) {
                sVar13 = strlen(local_338);
                (local_338 + sVar13)[0] = ',';
                (local_338 + sVar13)[1] = ' ';
                local_338[sVar13 + 2] = '\0';
              }
            }
            bVar4 = match_warn_of_mon(pmVar1);
            if (bVar4 != '\0') {
              if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
                 ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))
                 ) {
                pcVar12 = mons_mname(pmVar1->data);
                pcVar12 = makeplural(pcVar12);
                sprintf(local_138,"warned of %s",pcVar12);
                strcat(local_338,local_138);
              }
              else {
                sVar13 = strlen(local_338);
                builtin_strncpy(local_338 + sVar13,"paranoid",8);
                builtin_strncpy((char *)((long)&uStack_332 + sVar13 + 2)," delusio",8);
                *(undefined2 *)((long)auStack_328 + sVar13) = 0x6e;
              }
              if (1 < (int)uVar5) {
                sVar13 = strlen(local_338);
                (local_338 + sVar13)[0] = ',';
                (local_338 + sVar13)[1] = ' ';
                local_338[sVar13 + 2] = '\0';
              }
            }
          }
          if (local_338[0] != '\0') {
            sprintf(local_138," [seen: %s]",local_338);
            sVar13 = strlen(pcVar17);
            strncat(pcVar17,local_138,0xff - sVar13);
          }
        }
      }
      else if (uVar5 < 0x19a) {
        strcat(pcVar17,warnexplain[uVar5 - 0x194]);
      }
    }
  }
  if ((level->locations[x][y].field_0x6 & 8) != 0) {
    builtin_strncpy(bufs->invisdesc,"remembered, unseen, creature",0x1d);
  }
  if (((u._1052_1_ & 1) == 0) || ((u.ux == x && (u.uy == y)))) goto LAB_0020e996;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0020e949;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0020e944;
LAB_0020e976:
    pcVar17 = a_monnam(u.ustuck);
  }
  else {
LAB_0020e944:
    if (ublindf != (obj *)0x0) {
LAB_0020e949:
      if (ublindf->oartifact == '\x1d') goto LAB_0020e976;
    }
    pcVar17 = "a monster";
  }
  sprintf(bufs->effectdesc,"interior of %s",pcVar17);
LAB_0020e996:
  exit_jmp_buf_valid = exit_jmp_buf_valid + -1;
  return;
}

Assistant:

void nh_describe_pos(int x, int y, struct nh_desc_buf *bufs)
{
    int monid = dbuf_get_mon(x, y);
    
    bufs->bgdesc[0] = '\0';
    bufs->trapdesc[0] = '\0';
    bufs->objdesc[0] = '\0';
    bufs->mondesc[0] = '\0';
    bufs->invisdesc[0] = '\0';
    bufs->effectdesc[0] = '\0';
    bufs->objcount = -1;
    
    if (!program_state.game_running || !api_entry_checkpoint())
	return;
    
    describe_bg(x, y, level->locations[x][y].mem_bg, bufs->bgdesc);
    
    if (level->locations[x][y].mem_trap) {
	/* Avoid "monster trapped in a web on a web" from describe_mon(). */
	const struct monst *mtmp;
	const struct trap *t;
	if (!(monid &&					/* monster seen */
		(monid - 1) < NUMMONS &&		/* not a monster warning */
		!(u.ux == x && u.uy == y) &&		/* not the hero */
		(mtmp = m_at(level, x, y)) &&		/* monster at location */
		(mtmp->mtrapped && cansee(x, y)) &&	/* mon seen in trap */
		(t = t_at(level, x, y)) &&		/* trap at location */
		(t->ttyp == BEAR_TRAP || t->ttyp == PIT ||
		 t->ttyp == SPIKED_PIT || t->ttyp == WEB)))
	    strcpy(bufs->trapdesc, trapexplain[level->locations[x][y].mem_trap - 1]);
    }
    
    bufs->objcount = describe_object(x, y, level->locations[x][y].mem_obj - 1,
				     bufs->objdesc);
    
    describe_mon(x, y, monid - 1, bufs->mondesc);
    
    if (level->locations[x][y].mem_invis)
	strcpy(bufs->invisdesc, invisexplain);
    
    if (u.uswallow && (x != u.ux || y != u.uy)) {
	/* all locations when swallowed other than the hero are the monster */
	sprintf(bufs->effectdesc, "interior of %s", Blind ? "a monster" : a_monnam(u.ustuck));
    }
    
    api_exit();
}